

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

int __thiscall Node::IsSimpleInteger(Node *this)

{
  char *pcVar1;
  int iVar2;
  
  if (((this->Type - 0x1cfU < 2) &&
      (pcVar1 = (this->TextValue)._M_dataplus._M_p, (int)*pcVar1 - 0x30U < 10)) &&
     (iVar2 = (int)pcVar1[(this->TextValue)._M_string_length - 1],
     0xfffffff5 < iVar2 - 0x3aU || iVar2 == 0x25)) {
    return 1;
  }
  return 0;
}

Assistant:

int Node::IsSimpleInteger(void)
{
	//
	// Base type must be integer
	//
	if ((Type == BAS_V_INTEGER) || (Type == BAS_V_INT))
	{
		//
		// Has to start with a digit
		//
		if (isdigit(TextValue[0]))
		{
			//
			// has to end with a digit or a '%'
			//
			char LastChar = *(TextValue.end() - 1);
			if (isdigit(LastChar) || (LastChar == '%'))
			{
				return 1;
			}
		}
	}

	return 0;
}